

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall TestSuite::doTest(TestSuite *this,string *test_name,test_func *func)

{
  bool bVar1;
  string *psVar2;
  TestSuite **ppTVar3;
  function<int_()> *in_RDX;
  TestSuite *in_RDI;
  int ret;
  int in_stack_00000464;
  string *in_stack_00000468;
  TestSuite *in_stack_00000470;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = matchFilter(in_RDI,(string *)in_RDX);
  if (bVar1) {
    readyTest((TestSuite *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (string *)in_RDI);
    psVar2 = getResMsg_abi_cxx11_();
    std::__cxx11::string::operator=((string *)psVar2,"");
    psVar2 = getInfoMsg_abi_cxx11_();
    std::__cxx11::string::operator=((string *)psVar2,"");
    ppTVar3 = getCurTest();
    *ppTVar3 = in_RDI;
    std::function<int_()>::operator()(in_RDX);
    reportTestResult(in_stack_00000470,in_stack_00000468,in_stack_00000464);
  }
  return;
}

Assistant:

void doTest( const std::string& test_name,
                 test_func func )
    {
        if (!matchFilter(test_name)) return;

        readyTest(test_name);
        TestSuite::getResMsg() = "";
        TestSuite::getInfoMsg() = "";
        TestSuite::getCurTest() = this;
        int ret = func();
        reportTestResult(test_name, ret);
    }